

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O0

exr_result_t
exr_attr_opaquedata_set_unpacked
          (exr_context_t ctxt,exr_attr_opaquedata_t *u,void *unpacked,int32_t sz)

{
  int in_ECX;
  undefined8 in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI == (undefined4 *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
  }
  else if (in_ECX < 0) {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,3,"Opaque data given invalid negative size (%d)",in_ECX);
  }
  else {
    if ((*(long *)(in_RSI + 6) != 0) && (*(long *)(in_RSI + 0xc) != 0)) {
      (**(code **)(in_RSI + 0xc))(in_RDI,*(undefined8 *)(in_RSI + 6),in_RSI[1]);
    }
    *(undefined8 *)(in_RSI + 6) = in_RDX;
    in_RSI[1] = in_ECX;
    if (*(long *)(in_RSI + 4) != 0) {
      if (0 < (int)in_RSI[2]) {
        (**(code **)(in_RDI + 0x60))(*(undefined8 *)(in_RSI + 4));
      }
      *(undefined8 *)(in_RSI + 4) = 0;
      *in_RSI = 0;
      in_RSI[2] = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_opaquedata_set_unpacked (
    exr_context_t ctxt, exr_attr_opaquedata_t* u, void* unpacked, int32_t sz)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!u) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    /* TODO: do we care if the incoming unpacked data is null? */
    if (sz < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Opaque data given invalid negative size (%d)",
            sz);

    if (u->unpacked_data)
    {
        if (u->destroy_unpacked_func_ptr)
            u->destroy_unpacked_func_ptr (
                ctxt, u->unpacked_data, u->unpacked_size);
    }
    u->unpacked_data = unpacked;
    u->unpacked_size = sz;

    if (u->packed_data)
    {
        if (u->packed_alloc_size > 0) ctxt->free_fn (u->packed_data);
        u->packed_data       = NULL;
        u->size              = 0;
        u->packed_alloc_size = 0;
    }
    return EXR_ERR_SUCCESS;
}